

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O1

FT_Error tt_cmap4_init(TT_CMap4 cmap,FT_Byte *table)

{
  (cmap->cmap).data = table;
  cmap->num_ranges =
       (uint)((ushort)(*(ushort *)(table + 6) << 8 | *(ushort *)(table + 6) >> 8) >> 1);
  cmap->cur_charcode = 0xffffffff;
  cmap->cur_gindex = 0;
  return 0;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  tt_cmap4_init( TT_CMap4  cmap,
                 FT_Byte*  table )
  {
    FT_Byte*  p;


    cmap->cmap.data    = table;

    p                  = table + 6;
    cmap->num_ranges   = FT_PEEK_USHORT( p ) >> 1;
    cmap->cur_charcode = (FT_UInt32)0xFFFFFFFFUL;
    cmap->cur_gindex   = 0;

    return FT_Err_Ok;
  }